

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

void fill_yrange(chunk_conflict *c,wchar_t x,wchar_t y1,wchar_t y2,wchar_t feat,wchar_t flag,
                _Bool light)

{
  loc_conflict grid_00;
  square_conflict *psVar1;
  loc grid;
  wchar_t y;
  _Bool light_local;
  wchar_t flag_local;
  wchar_t feat_local;
  wchar_t y2_local;
  wchar_t y1_local;
  wchar_t x_local;
  chunk_conflict *c_local;
  
  for (grid.x = y1; grid.x <= y2; grid.x = grid.x + 1) {
    grid_00 = (loc_conflict)loc(x,grid.x);
    square_set_feat((chunk *)c,grid_00,feat);
    psVar1 = square((chunk *)c,grid_00);
    flag_on_dbg(psVar1->info,3,4,"square(c, grid)->info","SQUARE_ROOM");
    if (flag != L'\0') {
      psVar1 = square((chunk *)c,grid_00);
      flag_on_dbg(psVar1->info,3,flag,"square(c, grid)->info","flag");
    }
    if (light) {
      psVar1 = square((chunk *)c,grid_00);
      flag_on_dbg(psVar1->info,3,2,"square(c, grid)->info","SQUARE_GLOW");
    }
  }
  return;
}

Assistant:

static void fill_yrange(struct chunk *c, int x, int y1, int y2, int feat, 
						int flag, bool light)
{
	int y;
	for (y = y1; y <= y2; y++) {
		struct loc grid = loc(x, y);
		square_set_feat(c, grid, feat);
		sqinfo_on(square(c, grid)->info, SQUARE_ROOM);
		if (flag) sqinfo_on(square(c, grid)->info, flag);
		if (light)
			sqinfo_on(square(c, grid)->info, SQUARE_GLOW);
	}
}